

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinfo.cxx
# Opt level: O1

string * vigra::detail::trimString(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = s->_M_string_length;
  if (uVar5 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    uVar6 = 1;
    do {
      cVar1 = (s->_M_dataplus)._M_p[uVar4];
      if ((cVar1 != ' ') && (cVar1 != '\t')) break;
      bVar3 = uVar6 < uVar5;
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar3);
  }
  if (uVar5 != 0) {
    do {
      cVar1 = (s->_M_dataplus)._M_p[uVar5 - 1];
      if ((cVar1 != ' ') && (cVar1 != '\t')) goto LAB_0012ced2;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    uVar5 = 0;
  }
LAB_0012ced2:
  pcVar2 = (s->_M_dataplus)._M_p;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar2 + uVar4,pcVar2 + uVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string trimString(const std::string &s)
{
    unsigned int begin = 0;
    while(begin < s.size() && ((s[begin] == ' ') || (s[begin] == '\t')))
        ++begin;
    std::size_t end = s.size();
    while(end > 0 && ((s[end-1] == ' ') || (s[end-1] == '\t')))
        --end;
    return std::string(s.begin() + begin, s.begin() + end);
}